

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::_InternalSerialize
          (CategoricalCrossEntropyLossLayer *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  long lVar1;
  void *data;
  undefined8 *puVar2;
  ulong uVar3;
  uint8_t *puVar4;
  int size;
  size_t __n;
  
  puVar2 = (undefined8 *)((ulong)(this->input_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,
               "CoreML.Specification.CategoricalCrossEntropyLossLayer.input");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->input_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  puVar2 = (undefined8 *)((ulong)(this->target_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar1 = puVar2[1];
  if (lVar1 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((char *)*puVar2,(int)lVar1,SERIALIZE,
               "CoreML.Specification.CategoricalCrossEntropyLossLayer.target");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,2,(string *)
                                 ((ulong)(this->target_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),
                        target);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* CategoricalCrossEntropyLossLayer::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string input = 1;
  if (!this->_internal_input().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_input().data(), static_cast<int>(this->_internal_input().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalCrossEntropyLossLayer.input");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_input(), target);
  }

  // string target = 2;
  if (!this->_internal_target().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_target().data(), static_cast<int>(this->_internal_target().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CategoricalCrossEntropyLossLayer.target");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_target(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.CategoricalCrossEntropyLossLayer)
  return target;
}